

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O2

double CEDate::GregorianVect2Gregorian(vector<double,_std::allocator<double>_> *gregorian)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  size_type sVar4;
  double dVar5;
  
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](gregorian,0);
  dVar1 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](gregorian,0);
  dVar5 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](gregorian,1);
  dVar2 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](gregorian,2);
  dVar5 = ABS(dVar5) * 10000.0 + dVar2 * 100.0 + *pvVar3;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(gregorian);
  if (sVar4 == 4) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](gregorian,3);
    dVar5 = dVar5 + *pvVar3;
  }
  return (double)(int)*(double *)(&DAT_001510f0 + (ulong)(dVar1 < 0.0) * 8) * dVar5;
}

Assistant:

double CEDate::GregorianVect2Gregorian(std::vector<double> gregorian)
{
    int sign = (gregorian[0] < 0) ? -1.0 : 1.0;
    double ret = std::fabs(gregorian[0]) * 10000 +
                           gregorian[1]  * 100 +
                           gregorian[2];
    if (gregorian.size() == 4) {
        ret += gregorian[3];
    }
    return sign * ret;
}